

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_7acd3c::HandleArchiveCreateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _Any_data *p_Var1;
  _Alloc_hider __nptr;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char **ppcVar5;
  iterator iVar6;
  int *piVar7;
  long lVar8;
  offset_in_Arguments_to_MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  member;
  _Rb_tree_color compressType;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
  __l;
  char *knownFormats [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  char *zipFileFormats [2];
  Arguments parsedArgs;
  allocator_type local_2ae;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2ad;
  int local_2ac;
  undefined1 local_2a8 [48];
  string local_278;
  undefined1 local_258 [32];
  char *local_238;
  char *pcStack_230;
  undefined8 local_228;
  cmTarCompression local_220 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  local_218;
  undefined1 local_1e8 [16];
  pointer local_1d8;
  _Any_data _Stack_1d0;
  _Manager_type p_Stack_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  string local_198;
  key_type local_178;
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  bool local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  undefined1 local_f8 [32];
  undefined1 *local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  pStack_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_58;
  
  if (((anonymous_namespace)::
       HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_198.field_2._M_allocated_capacity = 0;
    local_198.field_2._8_8_ = 0;
    local_198._M_dataplus._M_p = (pointer)0x0;
    local_198._M_string_length = 0;
    local_1a8._M_allocated_capacity = 0;
    local_1a8._8_8_ = 0;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (void *)0x0;
    _Stack_1d0._8_8_ = (_Base_ptr)0x0;
    p_Stack_1c0 = (_Manager_type)0x0;
    local_1d8 = (pointer)0x0;
    _Stack_1d0._M_unused._M_object = (_Base_ptr)0x0;
    local_1e8._0_8_ = 0;
    local_1e8._8_8_ = 0;
    name.super_string_view._M_str = "OUTPUT";
    name.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1e8,name,0x30);
    name_00.super_string_view._M_str = "FORMAT";
    name_00.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1e8,name_00,0x50);
    name_01.super_string_view._M_str = "COMPRESSION";
    name_01.super_string_view._M_len = 0xb;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1e8,name_01,0x70);
    member = 0x90;
    name_02.super_string_view._M_str = "COMPRESSION_LEVEL";
    name_02.super_string_view._M_len = 0x11;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1e8,name_02,0x90);
    name_03.super_string_view._M_str = "MTIME";
    name_03.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<ArgumentParser::Maybe<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1e8,name_03,member);
    name_04.super_string_view._M_str = "VERBOSE";
    name_04.super_string_view._M_len = 7;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1e8,name_04,member)
    ;
    name_05.super_string_view._M_str = "PATHS";
    name_05.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1e8,name_05,member);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleArchiveCreateCommand::parser,(ActionMap *)local_1e8);
    ArgumentParser::Base::~Base((Base *)local_1e8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleArchiveCreateCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_f8._16_8_ = &local_218;
  local_218.first._M_len = 0;
  local_218.first._M_str = (char *)0x0;
  local_218.second.super__Function_base._M_functor._0_8_ = 0;
  local_258._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_258._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  _Stack_1d0._M_unused._0_8_ = (undefined8)(local_1e8 + 8);
  local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffff00000000;
  local_1d8 = (pointer)0x0;
  p_Stack_1c0 = (_Manager_type)0x0;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._8_8_ =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)0x0;
  local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_allocated_capacity =
       local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_158._M_p = (pointer)&local_148;
  local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_148._M_local_buf[0] = '\0';
  local_138._M_allocated_capacity = (size_type)&local_128;
  local_138._8_8_ = 0;
  local_128._M_local_buf[0] = '\0';
  local_118 = false;
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._0_8_ = &HandleArchiveCreateCommand::parser;
  local_f8._8_8_ = local_1e8;
  local_d8 = (undefined1 *)0x0;
  pStack_d0.first._M_dataplus._M_p = (char *)0x0;
  pStack_d0.first._M_string_length = 0;
  pStack_d0.first.field_2._M_allocated_capacity = 0;
  pStack_d0.first.field_2._8_8_ = (void *)0x0;
  pStack_d0._32_8_ = 0;
  local_a8.first._M_dataplus._M_p = (pointer)0x0;
  local_a8.first._M_string_length = 0;
  local_a8.first.field_2._M_local_buf[0] = false;
  _Stack_1d0._8_8_ = _Stack_1d0._M_unused._M_object;
  local_f8._24_8_ = local_f8._8_8_;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_f8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_258,0);
  if ((_Manager_type)local_a8.first._M_dataplus._M_p != (_Manager_type)0x0) {
    p_Var1 = (_Any_data *)((long)&pStack_d0.first.field_2 + 8);
    (*(code *)local_a8.first._M_dataplus._M_p)(p_Var1,p_Var1,__destroy_functor);
  }
  if ((char *)local_218.first._M_len != local_218.first._M_str) {
    local_f8._24_8_ = *(undefined8 *)local_218.first._M_len;
    local_f8._16_8_ = *(long *)(local_218.first._M_len + 8);
    local_f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x18;
    local_f8._8_8_ = "Unrecognized argument: \"";
    local_d8 = (undefined1 *)0x1;
    pStack_d0.first._M_dataplus._M_p = "\"";
    views._M_len = 3;
    views._M_array = (iterator)local_f8;
    cmCatViews_abi_cxx11_((string *)local_258,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_278.field_2._M_allocated_capacity = local_258._16_8_;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_258._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_258 + 0x10)) goto LAB_00257ddd;
    goto LAB_00257de5;
  }
  bVar2 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_1e8,status->Makefile);
  if (bVar2) {
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar2 = true;
    goto LAB_00257df1;
  }
  local_238 = "raw";
  pcStack_230 = "zip";
  local_258._16_8_ = (long)"archive_write_set_format_pax" + 0x19;
  local_258._24_8_ = "paxr";
  local_258._0_8_ = "7zip";
  local_258._8_8_ = "gnutar";
  if (((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)local_198._M_string_length ==
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)0x0) ||
     (ppcVar5 = std::
                __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_258,&local_228,&local_198), ppcVar5 != (char **)&local_228)) {
    local_218.second.super__Function_base._M_manager._0_4_ = 0x811805;
    local_218.second.super__Function_base._M_manager._4_4_ = 0;
    local_218.second._M_invoker._0_4_ = 0x811806;
    local_218.second._M_invoker._4_4_ = 0;
    if (((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
          *)local_178._M_string_length !=
         (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
          *)0x0) &&
       (ppcVar5 = std::
                  __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (&local_218.second.super__Function_base._M_manager,local_1e8,&local_198)
       , ppcVar5 != (char **)local_1e8)) {
      local_f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xf;
      local_f8._8_8_ = "archive format ";
      local_f8._16_8_ = local_198._M_string_length;
      local_f8._24_8_ = local_198._M_dataplus._M_p;
      local_d8 = &DAT_00000027;
      pStack_d0.first._M_dataplus._M_p = " does not support COMPRESSION arguments";
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_f8;
      cmCatViews_abi_cxx11_((string *)local_2a8,views_00);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0025824c;
    }
    if (((anonymous_namespace)::
         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::compressionTypeMap_abi_cxx11_ == '\0') &&
       (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::compressionTypeMap_abi_cxx11_), iVar4 != 0)) {
      local_2a8._0_4_ = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
      ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                  *)local_f8,(char (*) [5])0x7c5c47,(cmTarCompression *)local_2a8);
      local_278._M_dataplus._M_p._0_4_ = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
      ::pair<const_char_(&)[6],_cmSystemTools::cmTarCompression,_true>
                (&pStack_d0,(char (*) [6])"BZip2",(cmTarCompression *)&local_278);
      local_220[1] = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
      ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                (&local_a8,(char (*) [5])"GZip",local_220 + 1);
      local_220[0] = TarCompressXZ;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
      ::pair<const_char_(&)[3],_cmSystemTools::cmTarCompression,_true>
                (&local_80,(char (*) [3])"XZ",local_220);
      local_228._4_4_ = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
      ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                (&local_58,(char (*) [5])"Zstd",(cmTarCompression *)((long)&local_228 + 4));
      __l._M_len = 5;
      __l._M_array = (iterator)local_f8;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
      ::map(&(anonymous_namespace)::
             HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::compressionTypeMap_abi_cxx11_,__l,&local_2ad,&local_2ae);
      lVar8 = -200;
      paVar9 = &local_58.first.field_2;
      do {
        if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar9->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],
                          paVar9->_M_allocated_capacity + 1);
        }
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar9->_M_allocated_capacity + -5);
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
                   ::~map,&(anonymous_namespace)::
                           HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::compressionTypeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::compressionTypeMap_abi_cxx11_);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
            ::find(&(anonymous_namespace)::
                    HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                    ::compressionTypeMap_abi_cxx11_._M_t,&local_178);
    __nptr._M_p = local_158._M_p;
    if ((_Rb_tree_header *)iVar6._M_node ==
        &(anonymous_namespace)::
         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::compressionTypeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      if ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
           *)local_178._M_string_length !=
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
           *)0x0) {
        local_f8._0_8_ = &DAT_00000011;
        local_f8._8_8_ = "compression type ";
        local_f8._16_8_ = local_178._M_string_length;
        local_f8._24_8_ = local_178._M_dataplus._M_p;
        local_d8 = &DAT_00000011;
        pStack_d0.first._M_dataplus._M_p = " is not supported";
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_f8;
        cmCatViews_abi_cxx11_((string *)local_2a8,views_02);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0025824c;
      }
      compressType = 4;
    }
    else {
      compressType = iVar6._M_node[2]._M_color;
    }
    if (local_150 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if ((local_150 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1) || ((int)*local_158._M_p - 0x30U < 10)) {
        piVar7 = __errno_location();
        local_2ac = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(__nptr._M_p,(char **)local_f8,10);
        if ((pointer)local_f8._0_8_ == __nptr._M_p) {
          std::__throw_invalid_argument("stoi");
LAB_002585c0:
          std::__throw_out_of_range("stoi");
        }
        if (((int)(uint)lVar8 != lVar8) || (*piVar7 == 0x22)) goto LAB_002585c0;
        if (*piVar7 == 0) {
          *piVar7 = local_2ac;
        }
        if ((uint)lVar8 < 10) {
          if (compressType == 4) {
            local_f8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x39;
            local_f8._8_8_ = "compression level is not supported for compression \"None\"";
            local_f8._16_8_ = local_178._M_string_length;
            local_f8._24_8_ = local_178._M_dataplus._M_p;
            views_03._M_len = 2;
            views_03._M_array = (iterator)local_f8;
            cmCatViews_abi_cxx11_((string *)local_2a8,views_03);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0025824c;
          }
          goto LAB_002581b0;
        }
        local_f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x12;
        local_f8._8_8_ = "compression level ";
        local_2a8._0_8_ = local_150;
        local_2a8._8_8_ = local_158._M_p;
        cmStrCat<char[27]>(&local_278,(cmAlphaNum *)local_f8,(cmAlphaNum *)local_2a8,
                           (char (*) [27])" should be in range 0 to 9");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        local_f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x12;
        local_f8._8_8_ = "compression level ";
        local_2a8._0_8_ = local_150;
        local_2a8._8_8_ = local_158._M_p;
        cmStrCat<char[27]>(&local_278,(cmAlphaNum *)local_f8,(cmAlphaNum *)local_2a8,
                           (char (*) [27])" should be in range 0 to 9");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_);
      if (paVar9 == &local_278.field_2) goto LAB_00257de5;
      goto LAB_00257ddd;
    }
    lVar8 = 0;
LAB_002581b0:
    if (local_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = cmSystemTools::CreateTar
                        ((string *)local_1b8,&local_110,compressType,local_118,(string *)&local_138,
                         &local_198,(int)lVar8);
      bVar2 = true;
      if (bVar3) goto LAB_00257df1;
      local_f8._0_8_ = &DAT_00000014;
      local_f8._8_8_ = "failed to compress: ";
      local_f8._16_8_ = local_1b8._8_8_;
      local_f8._24_8_ = local_1b8._0_8_;
      views_04._M_len = 2;
      views_04._M_array = (iterator)local_f8;
      cmCatViews_abi_cxx11_((string *)local_2a8,views_04);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0025824c;
    }
    local_f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"ARCHIVE_CREATE requires a non-empty list of PATHS","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_278.field_2._M_allocated_capacity = local_f8._16_8_;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_f8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_f8 + 0x10)) goto LAB_00257ddd;
  }
  else {
    local_f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xf;
    local_f8._8_8_ = "archive format ";
    local_f8._16_8_ = local_198._M_string_length;
    local_f8._24_8_ = local_198._M_dataplus._M_p;
    local_d8 = (undefined1 *)0xe;
    pStack_d0.first._M_dataplus._M_p = " not supported";
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_f8;
    cmCatViews_abi_cxx11_((string *)local_2a8,views_01);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0025824c:
    local_278.field_2._M_allocated_capacity = local_2a8._16_8_;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_2a8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_2a8 + 0x10)) {
LAB_00257ddd:
      operator_delete(paVar9,(ulong)((long)&(((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
                                               *)local_278.field_2._M_allocated_capacity)->first).
                                            _M_len + 1));
    }
  }
LAB_00257de5:
  cmSystemTools::s_FatalErrorOccurred = true;
  bVar2 = false;
LAB_00257df1:
  HandleArchiveCreateCommand::Arguments::~Arguments((Arguments *)local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_218);
  return bVar2;
}

Assistant:

bool HandleArchiveCreateCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Output;
    std::string Format;
    std::string Compression;
    std::string CompressionLevel;
    // "MTIME" should require one value, but it has long been accidentally
    // accepted without one and treated as if an empty value were given.
    // Fixing this would require a policy.
    ArgumentParser::Maybe<std::string> MTime;
    bool Verbose = false;
    // "PATHS" requires at least one value, but use a custom check below.
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Paths;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("FORMAT"_s, &Arguments::Format)
      .Bind("COMPRESSION"_s, &Arguments::Compression)
      .Bind("COMPRESSION_LEVEL"_s, &Arguments::CompressionLevel)
      .Bind("MTIME"_s, &Arguments::MTime)
      .Bind("VERBOSE"_s, &Arguments::Verbose)
      .Bind("PATHS"_s, &Arguments::Paths);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  const char* knownFormats[] = {
    "7zip", "gnutar", "pax", "paxr", "raw", "zip"
  };

  if (!parsedArgs.Format.empty() &&
      !cm::contains(knownFormats, parsedArgs.Format)) {
    status.SetError(
      cmStrCat("archive format ", parsedArgs.Format, " not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  const char* zipFileFormats[] = { "7zip", "zip" };
  if (!parsedArgs.Compression.empty() &&
      cm::contains(zipFileFormats, parsedArgs.Format)) {
    status.SetError(cmStrCat("archive format ", parsedArgs.Format,
                             " does not support COMPRESSION arguments"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  static std::map<std::string, cmSystemTools::cmTarCompression>
    compressionTypeMap = { { "None", cmSystemTools::TarCompressNone },
                           { "BZip2", cmSystemTools::TarCompressBZip2 },
                           { "GZip", cmSystemTools::TarCompressGZip },
                           { "XZ", cmSystemTools::TarCompressXZ },
                           { "Zstd", cmSystemTools::TarCompressZstd } };

  cmSystemTools::cmTarCompression compress = cmSystemTools::TarCompressNone;
  auto typeIt = compressionTypeMap.find(parsedArgs.Compression);
  if (typeIt != compressionTypeMap.end()) {
    compress = typeIt->second;
  } else if (!parsedArgs.Compression.empty()) {
    status.SetError(cmStrCat("compression type ", parsedArgs.Compression,
                             " is not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  int compressionLevel = 0;
  if (!parsedArgs.CompressionLevel.empty()) {
    if (parsedArgs.CompressionLevel.size() != 1 &&
        !std::isdigit(parsedArgs.CompressionLevel[0])) {
      status.SetError(cmStrCat("compression level ",
                               parsedArgs.CompressionLevel,
                               " should be in range 0 to 9"));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    compressionLevel = std::stoi(parsedArgs.CompressionLevel);
    if (compressionLevel < 0 || compressionLevel > 9) {
      status.SetError(cmStrCat("compression level ",
                               parsedArgs.CompressionLevel,
                               " should be in range 0 to 9"));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    if (compress == cmSystemTools::TarCompressNone) {
      status.SetError(cmStrCat("compression level is not supported for "
                               "compression \"None\"",
                               parsedArgs.Compression));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  if (parsedArgs.Paths.empty()) {
    status.SetError("ARCHIVE_CREATE requires a non-empty list of PATHS");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!cmSystemTools::CreateTar(parsedArgs.Output, parsedArgs.Paths, compress,
                                parsedArgs.Verbose, parsedArgs.MTime,
                                parsedArgs.Format, compressionLevel)) {
    status.SetError(cmStrCat("failed to compress: ", parsedArgs.Output));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}